

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnp.cpp
# Opt level: O0

void __thiscall libtorrent::upnp::delete_port_mapping(upnp *this,rootdevice *d,port_mapping_t i)

{
  uint uVar1;
  bool bVar2;
  undefined8 uVar3;
  value_type *pvVar4;
  char *pcVar5;
  double __x;
  char local_428 [8];
  char soap [1024];
  char *soap_action;
  rootdevice *d_local;
  upnp *this_local;
  port_mapping_t i_local;
  
  this_local._4_4_ = i.m_val;
  bVar2 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&d->upnp_connection);
  if (bVar2) {
    soap._1016_8_ = anon_var_dwarf_1014917;
    uVar3 = ::std::__cxx11::string::c_str();
    pvVar4 = libtorrent::aux::
             container_wrapper<libtorrent::upnp::mapping_t,_libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>,_std::vector<libtorrent::upnp::mapping_t,_std::allocator<libtorrent::upnp::mapping_t>_>_>
             ::operator[](&d->mapping,
                          (strong_typedef<int,_libtorrent::port_mapping_tag,_void>)this_local._4_4_)
    ;
    uVar1 = (pvVar4->super_base_mapping).external_port;
    pvVar4 = libtorrent::aux::
             container_wrapper<libtorrent::upnp::mapping_t,_libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>,_std::vector<libtorrent::upnp::mapping_t,_std::allocator<libtorrent::upnp::mapping_t>_>_>
             ::operator[](&d->mapping,
                          (strong_typedef<int,_libtorrent::port_mapping_tag,_void>)this_local._4_4_)
    ;
    pcVar5 = libtorrent::aux::to_string((pvVar4->super_base_mapping).protocol);
    snprintf(local_428,0x400,
             "<?xml version=\"1.0\"?>\n<s:Envelope xmlns:s=\"http://schemas.xmlsoap.org/soap/envelope/\" s:encodingStyle=\"http://schemas.xmlsoap.org/soap/encoding/\"><s:Body><u:%s xmlns:u=\"%s\"><NewRemoteHost></NewRemoteHost><NewExternalPort>%u</NewExternalPort><NewProtocol>%s</NewProtocol></u:%s></s:Body></s:Envelope>"
             ,"DeletePortMapping",uVar3,(ulong)uVar1,pcVar5,soap._1016_8_);
    post(this,d,local_428,(char *)soap._1016_8_);
  }
  else {
    libtorrent::aux::strong_typedef::operator_cast_to_int((strong_typedef *)((long)&this_local + 4))
    ;
    log(this,__x);
  }
  return;
}

Assistant:

void upnp::delete_port_mapping(rootdevice& d, port_mapping_t const i)
{
	TORRENT_ASSERT(is_single_thread());

	TORRENT_ASSERT(d.magic == 1337);

	if (!d.upnp_connection)
	{
		TORRENT_ASSERT(d.disabled);
#ifndef TORRENT_DISABLE_LOGGING
		log("unmapping %u aborted", static_cast<int>(i));
#endif
		return;
	}

	char const* soap_action = "DeletePortMapping";

	char soap[1024];
	std::snprintf(soap, sizeof(soap), "<?xml version=\"1.0\"?>\n"
		"<s:Envelope xmlns:s=\"http://schemas.xmlsoap.org/soap/envelope/\" "
		"s:encodingStyle=\"http://schemas.xmlsoap.org/soap/encoding/\">"
		"<s:Body><u:%s xmlns:u=\"%s\">"
		"<NewRemoteHost></NewRemoteHost>"
		"<NewExternalPort>%u</NewExternalPort>"
		"<NewProtocol>%s</NewProtocol>"
		"</u:%s></s:Body></s:Envelope>"
		, soap_action, d.service_namespace.c_str()
		, d.mapping[i].external_port
		, to_string(d.mapping[i].protocol)
		, soap_action);

	post(d, soap, soap_action);
}